

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::setDefaults(Private_Impl_Still *this)

{
  Private_Impl_Still *this_local;
  
  this->width = 0x280;
  this->height = 0x1e0;
  this->encoding = RASPICAM_ENCODING_BMP;
  this->encoder = (MMAL_COMPONENT_T *)0x0;
  this->encoder_connection = (MMAL_CONNECTION_T *)0x0;
  this->sharpness = 0;
  this->contrast = 0;
  this->brightness = 0x32;
  this->quality = 0x55;
  this->saturation = 0;
  this->iso = 400;
  this->exposure = RASPICAM_EXPOSURE_AUTO;
  this->metering = RASPICAM_METERING_AVERAGE;
  this->awb = RASPICAM_AWB_AUTO;
  this->imageEffect = RASPICAM_IMAGE_EFFECT_NONE;
  this->rotation = 0;
  this->changedSettings = true;
  this->horizontalFlip = false;
  this->verticalFlip = false;
  return;
}

Assistant:

void Private_Impl_Still::setDefaults() {
            width = 640;
            height = 480;
            encoding = RASPICAM_ENCODING_BMP;
            encoder = NULL;
            encoder_connection = NULL;
            sharpness = 0;
            contrast = 0;
            brightness = 50;
            quality = 85;
            saturation = 0;
            iso = 400;
            //videoStabilisation = 0;
            //exposureCompensation = 0;
            exposure = RASPICAM_EXPOSURE_AUTO;
            metering = RASPICAM_METERING_AVERAGE;
            awb = RASPICAM_AWB_AUTO;
            imageEffect = RASPICAM_IMAGE_EFFECT_NONE;
            //colourEffects.enable = 0;
            //colourEffects.u = 128;
            //colourEffects.v = 128;
            rotation = 0;
            changedSettings = true;
            horizontalFlip = false;
            verticalFlip = false;
            //roi.x = params->roi.y = 0.0;
            //roi.w = params->roi.h = 1.0;
        }